

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::is_supported_argument_buffer_type(CompilerMSL *this,SPIRType *type)

{
  byte bVar1;
  
  if ((((type->basetype == Image) && ((type->image).sampled == 2)) &&
      ((this->msl_options).platform == iOS)) && ((int)(this->msl_options).argument_buffers_tier < 1)
     ) {
    bVar1 = 0;
  }
  else {
    bVar1 = (this->msl_options).use_framebuffer_fetch_subpasses ^ 1U |
            ((type->image).dim != DimSubpassData || type->basetype != Image);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool CompilerMSL::is_supported_argument_buffer_type(const SPIRType &type) const
{
	// iOS Tier 1 argument buffers do not support writable images.
	// When the argument buffer is encoded, we don't know whether this image will have a
	// NonWritable decoration, so just use discrete arguments for all storage images on iOS.
	bool is_supported_type = !(type.basetype == SPIRType::Image &&
							   type.image.sampled == 2 &&
							   msl_options.is_ios() &&
							   msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1);
	return is_supported_type && !type_is_msl_framebuffer_fetch(type);
}